

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_extension_instance
               (lys_ypr_ctx_conflict *pctx,ly_stmt substmt,uint8_t substmt_index,
               lysp_ext_instance *ext,int8_t *flag)

{
  uint local_84;
  char *local_78;
  size_t local_60;
  size_t name_len;
  size_t prefix_len;
  char *id;
  char *name;
  char *prefix;
  lysp_stmt *plStack_30;
  int8_t inner_flag;
  lysp_stmt *stmt;
  int8_t *flag_local;
  lysp_ext_instance *ext_local;
  uint8_t substmt_index_local;
  lys_ypr_ctx_conflict *plStack_10;
  ly_stmt substmt_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  if ((((ext->flags & 0x1000) == 0) && (ext->parent_stmt == substmt)) &&
     (ext->parent_stmt_index == (ulong)substmt_index)) {
    stmt = (lysp_stmt *)flag;
    flag_local = (int8_t *)ext;
    ext_local._3_1_ = substmt_index;
    ext_local._4_4_ = substmt;
    plStack_10 = pctx;
    ypr_close_parent(pctx,flag);
    prefix._7_1_ = '\0';
    if ((*(ushort *)(*(long *)(flag_local + 0x20) + 0x28) & 0x80) == 0) {
      local_78 = *(char **)(*(long *)(flag_local + 0x20) + 8);
    }
    else {
      local_78 = (char *)0x0;
    }
    ypr_open(plStack_10,*(char **)flag_local,local_78,*(char **)(flag_local + 8),'\0');
    (plStack_10->field_0).field_0.level = (plStack_10->field_0).field_0.level + 1;
    if ((*(ushort *)(*(long *)(flag_local + 0x20) + 0x28) & 0x80) != 0) {
      ypr_close_parent(plStack_10,(int8_t *)((long)&prefix + 7));
      prefix_len = *(size_t *)flag_local;
      ly_parse_nodeid((char **)&prefix_len,&name,&name_len,&id,&local_60);
      if (((plStack_10->field_0).field_0.options & 2) == 0) {
        local_84 = (uint)(plStack_10->field_0).field_0.level << 1;
      }
      else {
        local_84 = 0;
      }
      ly_print_((plStack_10->field_0).field_0.out,"%*s<%.*s:%s>",(ulong)local_84,"",
                name_len & 0xffffffff,name,*(undefined8 *)(*(long *)(flag_local + 0x20) + 8));
      lyxml_dump_text((plStack_10->field_0).field_0.out,*(char **)(flag_local + 8),'\0');
      ly_print_((plStack_10->field_0).field_0.out,"</%.*s:%s>\n",name_len & 0xffffffff,name,
                *(undefined8 *)(*(long *)(flag_local + 0x20) + 8));
    }
    for (plStack_30 = *(lysp_stmt **)(flag_local + 0x60); plStack_30 != (lysp_stmt *)0x0;
        plStack_30 = plStack_30->next) {
      if ((plStack_30->flags & 0xc00) == 0) {
        ypr_close_parent(plStack_10,(int8_t *)((long)&prefix + 7));
        yprp_stmt(plStack_10,plStack_30);
      }
    }
    (plStack_10->field_0).field_0.level = (plStack_10->field_0).field_0.level - 1;
    ypr_close(plStack_10,*(char **)flag_local,prefix._7_1_);
  }
  return;
}

Assistant:

static void
yprp_extension_instance(struct lys_ypr_ctx *pctx, enum ly_stmt substmt, uint8_t substmt_index,
        struct lysp_ext_instance *ext, int8_t *flag)
{
    struct lysp_stmt *stmt;
    int8_t inner_flag;

    if ((ext->flags & LYS_INTERNAL) || (ext->parent_stmt != substmt) || (ext->parent_stmt_index != substmt_index)) {
        return;
    }

    ypr_close_parent(pctx, flag);
    inner_flag = 0;

    ypr_open(pctx, ext->name, (ext->def->flags & LYS_YINELEM_TRUE) ? NULL : ext->def->argname, ext->argument, inner_flag);
    LEVEL++;
    if (ext->def->flags & LYS_YINELEM_TRUE) {
        const char *prefix, *name, *id;
        size_t prefix_len, name_len;

        ypr_close_parent(pctx, &inner_flag);

        /* we need to use the same namespace as for the extension instance element */
        id = ext->name;
        ly_parse_nodeid(&id, &prefix, &prefix_len, &name, &name_len);
        ly_print_(pctx->out, "%*s<%.*s:%s>", INDENT, (int)prefix_len, prefix, ext->def->argname);
        lyxml_dump_text(pctx->out, ext->argument, 0);
        ly_print_(pctx->out, "</%.*s:%s>\n", (int)prefix_len, prefix, ext->def->argname);
    }
    LY_LIST_FOR(ext->child, stmt) {
        if (stmt->flags & (LYS_YIN_ATTR | LYS_YIN_ARGUMENT)) {
            continue;
        }

        ypr_close_parent(pctx, &inner_flag);
        yprp_stmt(pctx, stmt);
    }
    LEVEL--;
    ypr_close(pctx, ext->name, inner_flag);
}